

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

date_t __thiscall
duckdb::TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>
          (OriginWidthConvertibleToMicrosTernaryOperator *this,interval_t bucket_width,date_t ts,
          date_t origin)

{
  timestamp_t timestamp;
  bool bVar1;
  int64_t right;
  int64_t left;
  int64_t iVar2;
  long lVar3;
  timestamp_t tVar4;
  date_t input;
  long left_00;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  date_t result;
  timestamp_t local_60;
  string local_58;
  OriginWidthConvertibleToMicrosTernaryOperator *local_38;
  int64_t local_30;
  
  local_30 = bucket_width._0_8_;
  input.days = bucket_width.micros._0_4_;
  local_38 = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    right = Interval::GetMicro((interval_t *)&local_38);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(input,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    tVar4.value._4_4_ = local_60.value._4_4_;
    tVar4.value._0_4_ = (int32_t)local_60.value;
    left = Timestamp::GetEpochMicroSeconds(tVar4);
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::timestamp_t>(ts,&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::timestamp_t>
                (&local_58,(duckdb *)(ulong)(uint)ts.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    timestamp.value._4_4_ = local_60.value._4_4_;
    timestamp.value._0_4_ = (int32_t)local_60.value;
    iVar2 = Timestamp::GetEpochMicroSeconds(timestamp);
    lVar3 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,iVar2 % right);
    left_00 = lVar3 - lVar3 % right;
    if (lVar3 % right != 0 && lVar3 < 0) {
      left_00 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left_00,right);
    }
    tVar4 = Timestamp::FromEpochMicroSeconds(left_00 + iVar2 % right);
    bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar4,(date_t *)&local_60,false);
    if (!bVar1) {
      auVar6 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
                (&local_58,(duckdb *)tVar4.value,(timestamp_t)auVar6._8_8_);
      InvalidInputException::InvalidInputException(auVar6._0_8_,&local_58);
      __cxa_throw(auVar6._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    bVar1 = TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,(date_t *)&local_60,false);
    if (!bVar1) {
      auVar5 = __cxa_allocate_exception(0x10);
      CastExceptionText<duckdb::date_t,duckdb::date_t>
                (&local_58,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
      InvalidInputException::InvalidInputException(auVar5._0_8_,&local_58);
      __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  return (date_t)(int32_t)local_60.value;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC origin) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			int64_t origin_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(origin));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, origin_micros));
		}